

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

decNumber * decNaNs(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set,uint32_t *status)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  if ((lhs->bits & 0x10) == 0) {
    if (rhs != (decNumber *)0x0) {
      if ((rhs->bits & 0x10) == 0) {
        if ((lhs->bits & 0x20) == 0) {
          lhs = rhs;
        }
      }
      else {
        *status = *status | 0x40000080;
        lhs = rhs;
      }
    }
  }
  else {
    *status = *status | 0x40000080;
  }
  uVar3 = set->digits;
  if ((int)uVar3 < lhs->digits) {
    res->bits = lhs->bits;
    if ((int)uVar3 < 0x32) {
      uVar3 = (uint)""[(int)uVar3];
    }
    for (lVar4 = 9; res->lsu + lVar4 + -9 < res->lsu + uVar3; lVar4 = lVar4 + 1) {
      res->lsu[lVar4 + -9] = lhs->lsu[lVar4 + -9];
    }
    iVar2 = set->digits;
    if ((long)iVar2 < 0x32) {
      bVar1 = ""[iVar2];
      res->digits = (uint)bVar1;
      if ((uint)bVar1 - iVar2 != 0 && iVar2 <= (int)(uint)bVar1) {
        decDecap(res,(uint)bVar1 - iVar2);
      }
    }
    else {
      res->digits = iVar2;
    }
  }
  else {
    uprv_decNumberCopy_63(res,lhs);
  }
  res->bits = res->bits & 0xcf | 0x20;
  res->exponent = 0;
  return res;
}

Assistant:

static decNumber * decNaNs(decNumber *res, const decNumber *lhs,
                           const decNumber *rhs, decContext *set,
                           uInt *status) {
  /* This decision tree ends up with LHS being the source pointer,  */
  /* and status updated if need be  */
  if (lhs->bits & DECSNAN)
    *status|=DEC_Invalid_operation | DEC_sNaN;
   else if (rhs==NULL);
   else if (rhs->bits & DECSNAN) {
    lhs=rhs;
    *status|=DEC_Invalid_operation | DEC_sNaN;
    }
   else if (lhs->bits & DECNAN);
   else lhs=rhs;

  /* propagate the payload  */
  if (lhs->digits<=set->digits) uprv_decNumberCopy(res, lhs); /* easy  */
   else { /* too long  */
    const Unit *ul;
    Unit *ur, *uresp1;
    /* copy safe number of units, then decapitate  */
    res->bits=lhs->bits;                /* need sign etc.  */
    uresp1=res->lsu+D2U(set->digits);
    for (ur=res->lsu, ul=lhs->lsu; ur<uresp1; ur++, ul++) *ur=*ul;
    res->digits=D2U(set->digits)*DECDPUN;
    /* maybe still too long  */
    if (res->digits>set->digits) decDecap(res, res->digits-set->digits);
    }

  res->bits&=~DECSNAN;        /* convert any sNaN to NaN, while  */
  res->bits|=DECNAN;          /* .. preserving sign  */
  res->exponent=0;            /* clean exponent  */
                              /* [coefficient was copied/decapitated]  */
  return res;
  }